

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv_tcp_getpeername(uv_tcp_t *handle,sockaddr *name,int *namelen)

{
  int iVar1;
  int *piVar2;
  socklen_t local_2c;
  socklen_t *psStack_28;
  socklen_t socklen;
  int *namelen_local;
  sockaddr *name_local;
  uv_tcp_t *handle_local;
  
  if (handle->delayed_error == 0) {
    if ((handle->io_watcher).fd < 0) {
      handle_local._4_4_ = -0x16;
    }
    else {
      local_2c = *namelen;
      psStack_28 = (socklen_t *)namelen;
      namelen_local = (int *)name;
      name_local = (sockaddr *)handle;
      iVar1 = getpeername((handle->io_watcher).fd,(sockaddr *)name,&local_2c);
      if (iVar1 == 0) {
        *psStack_28 = local_2c;
        handle_local._4_4_ = 0;
      }
      else {
        piVar2 = __errno_location();
        handle_local._4_4_ = -*piVar2;
      }
    }
  }
  else {
    handle_local._4_4_ = handle->delayed_error;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_tcp_getpeername(const uv_tcp_t* handle,
                       struct sockaddr* name,
                       int* namelen) {
  socklen_t socklen;

  if (handle->delayed_error)
    return handle->delayed_error;

  if (uv__stream_fd(handle) < 0)
    return UV_EINVAL;  /* FIXME(bnoordhuis) UV_EBADF */

  /* sizeof(socklen_t) != sizeof(int) on some systems. */
  socklen = (socklen_t) *namelen;

  if (getpeername(uv__stream_fd(handle), name, &socklen))
    return UV__ERR(errno);

  *namelen = (int) socklen;
  return 0;
}